

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LoadPropertySymAsArgument(Lowerer *this,Instr *instr,Opnd *fieldSrc)

{
  code *pcVar1;
  bool bVar2;
  SymOpnd *pSVar3;
  undefined4 *puVar4;
  PropertySym *pPVar5;
  IntConstOpnd *opndArg;
  Instr *pIVar6;
  RegOpnd *opndArg_00;
  
  bVar2 = IR::Opnd::IsSymOpnd(fieldSrc);
  if (bVar2) {
    pSVar3 = IR::Opnd::AsSymOpnd(fieldSrc);
    if (pSVar3->m_sym->m_kind == SymKindProperty) goto LAB_00566f42;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x1608,
                     "(fieldSrc->IsSymOpnd() && fieldSrc->AsSymOpnd()->m_sym->IsPropertySym())",
                     "Expected fieldSym as src of LdFld");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_00566f42:
  pSVar3 = IR::Opnd::AsSymOpnd(fieldSrc);
  pPVar5 = Sym::AsPropertySym(pSVar3->m_sym);
  opndArg = IR::IntConstOpnd::New((long)pPVar5->m_propertyId,TyInt32,this->m_func,true);
  pIVar6 = LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&opndArg->super_Opnd);
  opndArg_00 = IR::SymOpnd::CreatePropertyOwnerOpnd(pSVar3,this->m_func);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&opndArg_00->super_Opnd);
  return pIVar6;
}

Assistant:

IR::Instr *
Lowerer::LoadPropertySymAsArgument(IR::Instr *instr, IR::Opnd *fieldSrc)
{
    IR::Instr * instrPrev;
    AssertMsg(fieldSrc->IsSymOpnd() && fieldSrc->AsSymOpnd()->m_sym->IsPropertySym(), "Expected fieldSym as src of LdFld");

    IR::SymOpnd *symOpnd = fieldSrc->AsSymOpnd();
    PropertySym * fieldSym = symOpnd->m_sym->AsPropertySym();

    IR::IntConstOpnd * indexOpnd = IR::IntConstOpnd::New(fieldSym->m_propertyId, TyInt32, m_func, /*dontEncode*/true);
    instrPrev = m_lowererMD.LoadHelperArgument(instr, indexOpnd);

    IR::RegOpnd * instanceOpnd = symOpnd->CreatePropertyOwnerOpnd(m_func);
    m_lowererMD.LoadHelperArgument(instr, instanceOpnd);

    return instrPrev;
}